

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist_test.cpp
# Opt level: O3

pint p_test_case_plist_invalid_test(void)

{
  long lVar1;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar1 = p_list_remove(0,0);
  if (lVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x5f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar1 = p_list_last(0);
  if (lVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x60);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar1 = p_list_length(0);
  if (lVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x61);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar1 = p_list_reverse(0);
  if (lVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x62);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_list_free(0);
  p_list_foreach(0,0,0);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (plist_invalid_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_list_remove (NULL, NULL) == NULL);
	P_TEST_CHECK (p_list_last (NULL) == NULL);
	P_TEST_CHECK (p_list_length (NULL) == 0);
	P_TEST_CHECK (p_list_reverse (NULL) == NULL);

	p_list_free (NULL);
	p_list_foreach (NULL, NULL, NULL);

	p_libsys_shutdown ();
}